

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StronglyRegularToFA.h
# Opt level: O2

State __thiscall
covenant::StronglyRegularToFA<covenant::Sym>::MapSymToState
          (StronglyRegularToFA<covenant::Sym> *this,SymStateMap *M,Sym S)

{
  State SVar1;
  node_pointer ppVar2;
  const_key_type local_24;
  undefined8 local_20;
  
  local_24 = S.x >> 1;
  ppVar2 = boost::unordered::detail::
           table<boost::unordered::detail::map<std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_unsigned_int,_unsigned_int,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>_>
           ::find_node(&M->table_,&local_24);
  if (ppVar2 == (node_pointer)0x0) {
    SVar1 = DFA<covenant::Sym>::state
                      (&this->dfa,
                       (int)(((long)(this->dfa).trans.
                                    super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->dfa).trans.
                                   super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start) / 0x18));
    local_20 = CONCAT44(SVar1.id,S.x >> 1);
    boost::unordered::detail::
    table<boost::unordered::detail::map<std::allocator<std::pair<unsigned_int_const,unsigned_int>>,unsigned_int,unsigned_int,boost::hash<unsigned_int>,std::equal_to<unsigned_int>>>
    ::emplace_unique<std::pair<int,unsigned_int>>
              ((table<boost::unordered::detail::map<std::allocator<std::pair<unsigned_int_const,unsigned_int>>,unsigned_int,unsigned_int,boost::hash<unsigned_int>,std::equal_to<unsigned_int>>>
                *)M);
  }
  else {
    SVar1.id = *(uint *)((long)&(ppVar2->value_base_).data_.data_ + 4);
  }
  return (State)SVar1.id;
}

Assistant:

inline State MapSymToState(SymStateMap &M, EdgeSym S)
  {
    SymStateMap::iterator It = M.find(S.symID ());
    if (It != M.end())
      return mkState((*It).second);
    else
    {
      State q = dfa.state(dfa.nStates());
      M.insert(make_pair(S.symID (), q.id));
      return q;
    }
  }